

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

Id dxil_spv::build_load_physical_pointer
             (Impl *impl,ResourceReference *counter,Value *offset,CallInst *instruction)

{
  Id IVar1;
  Id IVar2;
  Builder *this;
  Operation *this_00;
  Operation *this_01;
  Value *local_78;
  Operation *load_op;
  Id offset_id;
  Operation *chain_op;
  Id uvec2_type;
  Id uint_type;
  Builder *builder;
  CallInst *instruction_local;
  Value *offset_local;
  ResourceReference *counter_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeUintType(this,0x20);
  IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
  IVar2 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar1);
  this_00 = Converter::Impl::allocate(impl,OpAccessChain,IVar2);
  Operation::add_id(this_00,counter->var_id);
  IVar2 = spv::Builder::makeUintConstant(this,0,false);
  Operation::add_id(this_00,IVar2);
  local_78 = offset;
  if ((counter->base_resource_is_array & 1U) == 0) {
    local_78 = (Value *)0x0;
  }
  IVar2 = build_bindless_heap_offset(impl,counter,0x100,local_78);
  IVar2 = build_physical_address_indexing_from_ssbo(impl,IVar2);
  Operation::add_id(this_00,IVar2);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpLoad,IVar1);
  Operation::add_id(this_01,this_00->id);
  Converter::Impl::add(impl,this_01,false);
  return this_01->id;
}

Assistant:

static spv::Id build_load_physical_pointer(Converter::Impl &impl, const Converter::Impl::ResourceReference &counter,
                                           const llvm::Value *offset, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	spv::Id uint_type = builder.makeUintType(32);
	spv::Id uvec2_type = builder.makeVectorType(uint_type, 2);

	auto *chain_op = impl.allocate(spv::OpAccessChain,
	                               builder.makePointer(spv::StorageClassStorageBuffer, uvec2_type));
	chain_op->add_id(counter.var_id);
	chain_op->add_id(builder.makeUintConstant(0));

	spv::Id offset_id = build_bindless_heap_offset(
		impl, counter, DESCRIPTOR_QA_TYPE_RAW_VA_BIT,
		counter.base_resource_is_array ? offset : nullptr);

	offset_id = build_physical_address_indexing_from_ssbo(impl, offset_id);

	chain_op->add_id(offset_id);
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, uvec2_type);
	load_op->add_id(chain_op->id);
	impl.add(load_op);

	return load_op->id;
}